

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O0

void __thiscall
icu_63::CollationRuleParser::parse
          (CollationRuleParser *this,UnicodeString *ruleString,UErrorCode *errorCode)

{
  int iVar1;
  UBool UVar2;
  char16_t cVar3;
  int32_t iVar4;
  UChar c;
  UErrorCode *errorCode_local;
  UnicodeString *ruleString_local;
  CollationRuleParser *this_local;
  
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 == '\0') {
    this->rules = ruleString;
    this->ruleIndex = 0;
    do {
      while( true ) {
        iVar1 = this->ruleIndex;
        iVar4 = UnicodeString::length(this->rules);
        if (iVar4 <= iVar1) {
          return;
        }
        cVar3 = UnicodeString::charAt(this->rules,this->ruleIndex);
        UVar2 = PatternProps::isWhiteSpace((uint)(ushort)cVar3);
        if (UVar2 == '\0') break;
        this->ruleIndex = this->ruleIndex + 1;
      }
      if (cVar3 == L'!') {
        this->ruleIndex = this->ruleIndex + 1;
      }
      else if (cVar3 == L'#') {
        iVar4 = skipComment(this,this->ruleIndex + 1);
        this->ruleIndex = iVar4;
      }
      else if (cVar3 == L'&') {
        parseRuleChain(this,errorCode);
      }
      else if (cVar3 == L'@') {
        CollationSettings::setFlag(this->settings,0x800,UCOL_ON,0,errorCode);
        this->ruleIndex = this->ruleIndex + 1;
      }
      else if (cVar3 == L'[') {
        parseSetting(this,errorCode);
      }
      else {
        setParseError(this,"expected a reset or setting or comment",errorCode);
      }
      UVar2 = ::U_FAILURE(*errorCode);
    } while (UVar2 == '\0');
  }
  return;
}

Assistant:

void
CollationRuleParser::parse(const UnicodeString &ruleString, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    rules = &ruleString;
    ruleIndex = 0;

    while(ruleIndex < rules->length()) {
        UChar c = rules->charAt(ruleIndex);
        if(PatternProps::isWhiteSpace(c)) {
            ++ruleIndex;
            continue;
        }
        switch(c) {
        case 0x26:  // '&'
            parseRuleChain(errorCode);
            break;
        case 0x5b:  // '['
            parseSetting(errorCode);
            break;
        case 0x23:  // '#' starts a comment, until the end of the line
            ruleIndex = skipComment(ruleIndex + 1);
            break;
        case 0x40:  // '@' is equivalent to [backwards 2]
            settings->setFlag(CollationSettings::BACKWARD_SECONDARY,
                              UCOL_ON, 0, errorCode);
            ++ruleIndex;
            break;
        case 0x21:  // '!' used to turn on Thai/Lao character reversal
            // Accept but ignore. The root collator has contractions
            // that are equivalent to the character reversal, where appropriate.
            ++ruleIndex;
            break;
        default:
            setParseError("expected a reset or setting or comment", errorCode);
            break;
        }
        if(U_FAILURE(errorCode)) { return; }
    }
}